

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::LinkProgram(SACSubcaseBase *this,GLuint program)

{
  CallLogWrapper *this_00;
  GLsizei length;
  GLchar log [1024];
  int local_41c;
  GLchar local_418 [1024];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,&local_41c,local_418);
  if (1 < local_41c) {
    anon_unknown_0::Output("Program Info Log:\n%s\n",local_418);
  }
  return;
}

Assistant:

void LinkProgram(GLuint program)
	{
		glLinkProgram(program);
		GLsizei length;
		GLchar  log[1024];
		glGetProgramInfoLog(program, sizeof(log), &length, log);
		if (length > 1)
		{
			Output("Program Info Log:\n%s\n", log);
		}
	}